

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void gl4cts::EnhancedLayouts::Utils::VertexArray::AttribPointer
               (Functions *gl,GLuint index,Type *type,GLuint n_array_elements,GLboolean normalized,
               GLsizei stride,GLvoid *pointer)

{
  GLuint GVar1;
  TYPES TVar2;
  GLuint GVar3;
  GLenum GVar4;
  int iVar5;
  GLenum err;
  TestError *this;
  int line;
  uint uVar6;
  char *msg;
  void *pvVar7;
  ulong uVar8;
  
  GVar3 = Utils::Type::GetTypeSize(type->m_basic_type);
  GVar1 = type->m_n_rows;
  GVar4 = Utils::Type::GetTypeGLenum(type->m_basic_type);
  uVar8 = 0;
  iVar5 = 0;
  do {
    if (type->m_n_columns != 0) {
      uVar6 = 1;
      do {
        pvVar7 = (void *)(uVar8 + (long)pointer);
        TVar2 = type->m_basic_type;
        if (TVar2 - Int < 2) {
          (*gl->vertexAttribIPointer)(index,GVar1,GVar4,stride,pvVar7);
          err = (*gl->getError)();
          msg = "VertexAttribIPointer";
          line = 0xe1e;
        }
        else if (TVar2 == Double) {
          (*gl->vertexAttribLPointer)(index,GVar1,GVar4,stride,pvVar7);
          err = (*gl->getError)();
          msg = "VertexAttribLPointer";
          line = 0xe22;
        }
        else {
          if (TVar2 != Float) {
            this = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this,"Invalid enum",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                       ,0xe25);
            __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          (*gl->vertexAttribPointer)(index,GVar1,GVar4,normalized,stride,pvVar7);
          err = (*gl->getError)();
          msg = "VertexAttribPointer";
          line = 0xe19;
        }
        glu::checkError(err,msg,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,line);
        uVar8 = (ulong)((int)uVar8 + GVar3 * GVar1);
        index = index + 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 <= type->m_n_columns);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != n_array_elements + (n_array_elements == 0));
  return;
}

Assistant:

void VertexArray::AttribPointer(const Functions& gl, GLuint index, const Type& type, GLuint n_array_elements,
								GLboolean normalized, GLsizei stride, const GLvoid* pointer)
{
	const GLuint basic_type_size = Type::GetTypeSize(type.m_basic_type);
	const GLint  size			 = (GLint)type.m_n_rows;
	const GLuint column_size	 = (GLuint)size * basic_type_size;
	const GLenum gl_type		 = Type::GetTypeGLenum(type.m_basic_type);

	GLuint offset = 0;

	/* If attribute is not an array */
	if (0 == n_array_elements)
	{
		n_array_elements = 1;
	}

	/* For each element in array */
	for (GLuint element = 0; element < n_array_elements; ++element)
	{
		/* For each column in matrix */
		for (GLuint column = 1; column <= type.m_n_columns; ++column)
		{
			/* Calculate offset */
			const GLvoid* ptr = (GLubyte*)pointer + offset;

			/* Set up attribute */
			switch (type.m_basic_type)
			{
			case Type::Float:
				gl.vertexAttribPointer(index, size, gl_type, normalized, stride, ptr);
				GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribPointer");
				break;
			case Type::Int:
			case Type::Uint:
				gl.vertexAttribIPointer(index, size, gl_type, stride, ptr);
				GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribIPointer");
				break;
			case Type::Double:
				gl.vertexAttribLPointer(index, size, gl_type, stride, ptr);
				GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribLPointer");
				break;
			default:
				TCU_FAIL("Invalid enum");
			}

			/* Next location */
			offset += column_size;
			index += 1;
		}
	}
}